

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O0

REF_STATUS
ref_collapse_edge_geometry(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  REF_CELL ref_cell;
  REF_CELL ref_cell_00;
  REF_GEOM ref_geom_00;
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rxs;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL edge_side;
  REF_BOOL geom_edge1;
  REF_BOOL geom_node1;
  REF_INT id1;
  REF_INT id0;
  REF_INT cell_to_collapse [100];
  int local_cc;
  int local_c8;
  REF_INT ncell;
  REF_INT ids1 [3];
  REF_INT degree1;
  REF_INT nodes [27];
  REF_GEOM ref_geom;
  REF_CELL ref_edg;
  REF_CELL ref_tri;
  REF_BOOL *allowed_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_GRID ref_grid_local;
  
  ref_cell = ref_grid->cell[3];
  ref_cell_00 = ref_grid->cell[0];
  ref_geom_00 = ref_grid->geom;
  *allowed = 0;
  ref_grid_local._4_4_ = ref_geom_is_a(ref_geom_00,node1,0,&edge_side);
  if (ref_grid_local._4_4_ == 0) {
    if (edge_side == 0) {
      ref_grid_local._4_4_ = ref_geom_is_a(ref_geom_00,node1,1,&ref_private_macro_code_rss);
      if (ref_grid_local._4_4_ == 0) {
        if (ref_private_macro_code_rss == 0) {
          ref_grid_local._4_4_ = ref_cell_id_list_around(ref_cell,node1,3,ids1 + 1,&local_c8);
          if ((ref_grid_local._4_4_ == 0) || (ref_grid_local._4_4_ == 7)) {
            switch(ids1[1]) {
            case 0:
              *allowed = 1;
              break;
            case 1:
              uVar1 = ref_cell_has_side(ref_cell,node0,node1,allowed);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                       ,0x1b2,"ref_collapse_edge_geometry",(ulong)uVar1,
                       "allowed if a side of a triangle");
                return uVar1;
              }
              break;
            case 2:
              uVar1 = ref_cell_list_with2(ref_cell,node0,node1,100,&local_cc,&id1);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                       ,0x1a3,"ref_collapse_edge_geometry",(ulong)uVar1,"list");
                return uVar1;
              }
              if (local_cc == 2) {
                uVar1 = ref_cell_nodes(ref_cell,id1,ids1 + 2);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                         ,0x1a8,"ref_collapse_edge_geometry",(ulong)uVar1,"nodes");
                  return uVar1;
                }
                geom_node1 = nodes[1];
                uVar1 = ref_cell_nodes(ref_cell,id0,ids1 + 2);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                         ,0x1aa,"ref_collapse_edge_geometry",(ulong)uVar1,"nodes");
                  return uVar1;
                }
                if (((geom_node1 == local_c8) && (nodes[1] == ncell)) ||
                   ((nodes[1] == local_c8 && (geom_node1 == ncell)))) {
                  *allowed = 1;
                }
              }
              else {
                *allowed = 0;
              }
              break;
            case 3:
              *allowed = 0;
            }
            ref_grid_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                   ,0x19a,"ref_collapse_edge_geometry",(ulong)ref_grid_local._4_4_,"count faceids");
          }
        }
        else {
          ref_grid_local._4_4_ =
               ref_cell_has_side(ref_cell_00,node0,node1,&ref_private_macro_code_rss_1);
          if (ref_grid_local._4_4_ == 0) {
            if (ref_private_macro_code_rss_1 == 0) {
              ref_grid_local._4_4_ = 0;
            }
            else {
              *allowed = 1;
              ref_grid_local._4_4_ = 0;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                   ,0x192,"ref_collapse_edge_geometry",(ulong)ref_grid_local._4_4_,
                   "allowed if a side of a triangle");
          }
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               399,"ref_collapse_edge_geometry",(ulong)ref_grid_local._4_4_,"edge check 1");
      }
    }
    else {
      *allowed = 0;
      ref_grid_local._4_4_ = 0;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
           0x187,"ref_collapse_edge_geometry",(ulong)ref_grid_local._4_4_,"node check");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge_geometry(REF_GRID ref_grid, REF_INT node0,
                                              REF_INT node1,
                                              REF_BOOL *allowed) {
  REF_CELL ref_tri = ref_grid_tri(ref_grid);
  REF_CELL ref_edg = ref_grid_edg(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT degree1;
  REF_INT ids1[3];

  REF_INT ncell;
  REF_INT cell_to_collapse[MAX_CELL_COLLAPSE];
  REF_INT id0, id1;

  REF_BOOL geom_node1;
  REF_BOOL geom_edge1;
  REF_BOOL edge_side;

  *allowed = REF_FALSE;

  /* don't remove a geometry CAD node */
  RSS(ref_geom_is_a(ref_geom, node1, REF_GEOM_NODE, &geom_node1), "node check");
  if (geom_node1) {
    *allowed = REF_FALSE;
    return REF_SUCCESS;
  }

  /* geometry edge allowed if collapse is on edge */
  RSS(ref_geom_is_a(ref_geom, node1, REF_GEOM_EDGE, &geom_edge1),
      "edge check 1");
  if (geom_edge1) {
    RSS(ref_cell_has_side(ref_edg, node0, node1, &edge_side),
        "allowed if a side of a triangle");
    if (!edge_side) return REF_SUCCESS;
    *allowed = REF_TRUE;
    return REF_SUCCESS;
  }

  /* ids1 is a list of degree1 face ids for node1 */
  RXS(ref_cell_id_list_around(ref_tri, node1, 3, &degree1, ids1),
      REF_INCREASE_LIMIT, "count faceids");

  switch (degree1) {
    case 3: /* geometry node never allowed to move */
      *allowed = REF_FALSE;
      break;
    case 2: /* geometry edge allowed if collapse is on edge */
      RSS(ref_cell_list_with2(ref_tri, node0, node1, MAX_CELL_COLLAPSE, &ncell,
                              cell_to_collapse),
          "list");
      if (2 != ncell) {
        *allowed = REF_FALSE;
        break;
      }
      RSS(ref_cell_nodes(ref_tri, cell_to_collapse[0], nodes), "nodes");
      id0 = nodes[3];
      RSS(ref_cell_nodes(ref_tri, cell_to_collapse[1], nodes), "nodes");
      id1 = nodes[3];
      if ((id0 == ids1[0] && id1 == ids1[1]) ||
          (id1 == ids1[0] && id0 == ids1[1]))
        *allowed = REF_TRUE;
      break;
    case 1: /* geometry face allowed if on that face */
      RSS(ref_cell_has_side(ref_tri, node0, node1, allowed),
          "allowed if a side of a triangle");
      break;
    case 0: /* volume node always allowed */
      *allowed = REF_TRUE;
      break;
  }

  return REF_SUCCESS;
}